

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DP.c
# Opt level: O0

logical own_patch(Integer g_a,Integer ilo,Integer ihi,Integer jlo,Integer jhi)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_R8;
  Integer hi [2];
  Integer lo [2];
  Integer me;
  Integer jhip;
  Integer jlop;
  Integer ihip;
  Integer ilop;
  Integer *in_stack_00000298;
  Integer *in_stack_000002a0;
  Integer in_stack_000002a8;
  Integer in_stack_000002b0;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_8;
  
  pnga_nodeid();
  pnga_distribution(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298);
  if ((((local_78 == in_RDX) && (local_68 == in_RSI)) && (local_70 == in_R8)) &&
     (local_60 == in_RCX)) {
    local_8 = 1;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static logical own_patch(g_a, ilo, ihi, jlo, jhi)
     Integer g_a, ilo, ihi, jlo, jhi;
{
   Integer ilop, ihip, jlop, jhip, me=pnga_nodeid();
   Integer lo[2],hi[2];

   pnga_distribution(g_a, me, lo, hi);
   ilop = lo[0];
   jlop = lo[1];
   ihip = hi[0];
   jhip = hi[1];
   if(ihip != ihi || ilop != ilo || jhip != jhi || jlop != jlo) return(FALSE);
   else return(TRUE);
}